

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizesToArray
          (FileDescriptorProto *this,uint8 *target)

{
  string *psVar1;
  char *data;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  undefined8 *puVar6;
  uint32 uVar7;
  long lVar8;
  uint8 *puVar9;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar1 = this->name_;
    *target = '\n';
    uVar7 = (uint32)psVar1->_M_string_length;
    if (uVar7 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar9 = target + 2;
    }
    else {
      puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar9);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,SERIALIZE);
    psVar1 = this->package_;
    *target = '\x12';
    uVar7 = (uint32)psVar1->_M_string_length;
    if (uVar7 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar9 = target + 2;
    }
    else {
      puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar9);
  }
  uVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    lVar8 = 0;
    do {
      puVar6 = (undefined8 *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar8];
      data = (char *)*puVar6;
      if ((int)uVar5 <= lVar8) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
        puVar6 = (undefined8 *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar8];
      }
      internal::WireFormat::VerifyUTF8StringFallback(data,*(int *)(puVar6 + 1),SERIALIZE);
      if ((this->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar8) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
      }
      puVar6 = (undefined8 *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar8];
      *target = '\x1a';
      uVar7 = (uint32)puVar6[1];
      if (uVar7 < 0x80) {
        target[1] = (uint8)puVar6[1];
        puVar9 = target + 2;
      }
      else {
        puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
      }
      target = io::CodedOutputStream::WriteRawToArray((void *)*puVar6,*(int *)(puVar6 + 1),puVar9);
      lVar8 = lVar8 + 1;
      uVar5 = (ulong)(this->dependency_).super_RepeatedPtrFieldBase.current_size_;
    } while (lVar8 < (long)uVar5);
  }
  if (0 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      this_00 = (DescriptorProto *)(this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar8]
      ;
      *target = '\"';
      uVar3 = this_00->_cached_size_;
      if (uVar3 < 0x80) {
        target[1] = (uint8)uVar3;
        puVar9 = target + 2;
      }
      else {
        puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
      }
      target = DescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      this_01 = (EnumDescriptorProto *)
                (this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar8];
      *target = '*';
      uVar3 = this_01->_cached_size_;
      if (uVar3 < 0x80) {
        target[1] = (uint8)uVar3;
        puVar9 = target + 2;
      }
      else {
        puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
      }
      target = EnumDescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->service_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      this_02 = (ServiceDescriptorProto *)
                (this->service_).super_RepeatedPtrFieldBase.elements_[lVar8];
      *target = '2';
      uVar3 = this_02->_cached_size_;
      if (uVar3 < 0x80) {
        target[1] = (uint8)uVar3;
        puVar9 = target + 2;
      }
      else {
        puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
      }
      target = ServiceDescriptorProto::SerializeWithCachedSizesToArray(this_02,puVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      this_03 = (FieldDescriptorProto *)
                (this->extension_).super_RepeatedPtrFieldBase.elements_[lVar8];
      *target = ':';
      uVar3 = this_03->_cached_size_;
      if (uVar3 < 0x80) {
        target[1] = (uint8)uVar3;
        puVar9 = target + 2;
      }
      else {
        puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
      }
      target = FieldDescriptorProto::SerializeWithCachedSizesToArray(this_03,puVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  uVar3 = this->_has_bits_[0];
  if ((uVar3 >> 9 & 1) != 0) {
    this_04 = this->options_;
    if (this_04 == (FileOptions *)0x0) {
      this_04 = *(FileOptions **)(default_instance_ + 0xb8);
    }
    *target = 'B';
    uVar3 = this_04->_cached_size_;
    if (uVar3 < 0x80) {
      target[1] = (uint8)uVar3;
      puVar9 = target + 2;
    }
    else {
      puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
    }
    target = FileOptions::SerializeWithCachedSizesToArray(this_04,puVar9);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 >> 10 & 1) != 0) {
    this_05 = this->source_code_info_;
    if (this_05 == (SourceCodeInfo *)0x0) {
      this_05 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
    }
    *target = 'J';
    uVar3 = this_05->_cached_size_;
    if (uVar3 < 0x80) {
      target[1] = (uint8)uVar3;
      puVar9 = target + 2;
    }
    else {
      puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
    }
    target = SourceCodeInfo::SerializeWithCachedSizesToArray(this_05,puVar9);
  }
  if (0 < (this->public_dependency_).current_size_) {
    lVar8 = 0;
    do {
      uVar3 = (this->public_dependency_).elements_[lVar8];
      *target = 'P';
      if ((long)(int)uVar3 < 0) {
        target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar3,target + 1);
      }
      else if (uVar3 < 0x80) {
        target[1] = (uint8)uVar3;
        target = target + 2;
      }
      else {
        target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->public_dependency_).current_size_);
  }
  if (0 < (this->weak_dependency_).current_size_) {
    lVar8 = 0;
    do {
      uVar3 = (this->weak_dependency_).elements_[lVar8];
      *target = 'X';
      if ((long)(int)uVar3 < 0) {
        target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar3,target + 1);
      }
      else if (uVar3 < 0x80) {
        target[1] = (uint8)uVar3;
        target = target + 2;
      }
      else {
        target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target + 1);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->weak_dependency_).current_size_);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    target = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (has_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0; i < this->dependency_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (int i = 0; i < this->message_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->message_type(i), target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (int i = 0; i < this->enum_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        5, this->enum_type(i), target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (int i = 0; i < this->service_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        6, this->service(i), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (int i = 0; i < this->extension_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        7, this->extension(i), target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (has_source_code_info()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        9, this->source_code_info(), target);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0; i < this->public_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(10, this->public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0; i < this->weak_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(11, this->weak_dependency(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}